

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O2

char8_t * jessilib::parse_decimal_part<char8_t,long_double>
                    (char8_t *in_str,char8_t *in_str_end,longdouble *out_value)

{
  int iVar1;
  longdouble lVar2;
  longdouble lVar3;
  
  lVar3 = *out_value;
  iVar1 = 10;
  for (; (in_str != in_str_end && ((byte)(*in_str - 0x30U) < 10));
      in_str = (char8_t *)((byte *)in_str + 1)) {
    lVar2 = (longdouble)(int)((byte)*in_str - 0x30) / (longdouble)iVar1;
    if (lVar3 < (longdouble)0) {
      lVar2 = -lVar2;
    }
    lVar3 = lVar2 + lVar3;
    *out_value = lVar3;
    iVar1 = iVar1 * 10;
  }
  return in_str;
}

Assistant:

const CharT* parse_decimal_part(const CharT* in_str, const CharT* in_str_end, NumberT& out_value) {
	int denominator = 10;
	while (in_str != in_str_end) {
		switch (*in_str) {
			case '0':
			case '1':
			case '2':
			case '3':
			case '4':
			case '5':
			case '6':
			case '7':
			case '8':
			case '9':
				if (out_value >= 0.0) {
					out_value += (static_cast<NumberT>(*in_str - '0') / denominator);
				}
				else {
					out_value -= (static_cast<NumberT>(*in_str - '0') / denominator);
				}
				denominator *= 10;
				break;

			default:
				return in_str;
		}

		++in_str;
	}

	return in_str;
}